

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.hpp
# Opt level: O0

void __thiscall
deqp::gls::fboc::details::ParamTest<deqp::gles3::Functional::NumSamplesParams>::ParamTest
          (ParamTest<deqp::gles3::Functional::NumSamplesParams> *this,Context *ctx,Params *params)

{
  NumSamplesParams *params_00;
  string local_60;
  string local_40;
  NumSamplesParams *local_20;
  Params *params_local;
  Context *ctx_local;
  ParamTest<deqp::gles3::Functional::NumSamplesParams> *this_local;
  
  local_20 = params;
  params_local = (Params *)ctx;
  ctx_local = (Context *)this;
  deqp::gles3::Functional::NumSamplesParams::getName_abi_cxx11_(&local_40,params,params);
  deqp::gles3::Functional::NumSamplesParams::getDescription_abi_cxx11_(&local_60,local_20,params_00)
  ;
  TestBase::TestBase(&this->super_TestBase,ctx,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_TestBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ParamTest_032a2448;
  *(undefined8 *)(this->m_params).numSamples = *(undefined8 *)local_20->numSamples;
  (this->m_params).numSamples[2] = local_20->numSamples[2];
  return;
}

Assistant:

ParamTest		(Context& ctx, const Params& params)
					: TestBase	(ctx, Params::getName(params), Params::getDescription(params))
					, m_params	(params) {}